

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

bool __thiscall
vkb::detail::GenericFeatureChain::match_all
          (GenericFeatureChain *this,GenericFeatureChain *extension_requested)

{
  pointer pGVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  pointer pGVar5;
  long lVar6;
  
  pGVar5 = (extension_requested->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (extension_requested->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pGVar1 - (long)pGVar5 ==
      (long)(this->nodes).
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->nodes).
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = true;
    if (pGVar1 != pGVar5) {
      lVar6 = 0;
      uVar4 = 0;
      do {
        pGVar1 = (this->nodes).
                 super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->nodes).
                           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 4) *
                   0xfc0fc0fc0fc0fc1) <= uVar4) {
          return true;
        }
        bVar2 = GenericFeaturesPNextNode::match
                          ((GenericFeaturesPNextNode *)((long)pGVar5->fields + lVar6 + -0x10),
                           (GenericFeaturesPNextNode *)((long)pGVar1->fields + lVar6 + -0x10));
        if (!bVar2) goto LAB_0012fe4f;
        uVar4 = uVar4 + 1;
        pGVar5 = (extension_requested->nodes).
                 super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x410;
      } while (uVar4 < (ulong)(((long)(extension_requested->nodes).
                                      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar5 >> 4
                               ) * 0xfc0fc0fc0fc0fc1));
    }
  }
  else {
LAB_0012fe4f:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool GenericFeatureChain::match_all(GenericFeatureChain const& extension_requested) const noexcept {
    // Should only be false if extension_supported was unable to be filled out, due to the
    // physical device not supporting vkGetPhysicalDeviceFeatures2 in any capacity.
    if (extension_requested.nodes.size() != nodes.size()) {
        return false;
    }

    for (size_t i = 0; i < extension_requested.nodes.size() && i < nodes.size(); ++i) {
        if (!GenericFeaturesPNextNode::match(extension_requested.nodes[i], nodes[i])) return false;
    }
    return true;
}